

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

NodeSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::newGroupNode
          (NodeSourceInfoBuilderPair *__return_storage_ptr__,StructTranslator *this,Reader parent,
          Reader decl)

{
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> **ppRVar1;
  NodeTranslator *pNVar2;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar3;
  undefined8 uVar4;
  CapTableReader *pCVar5;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar6;
  byte bVar7;
  SegmentReader *pSVar8;
  size_t newSize;
  ArrayPtr<const_char> *in_R8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Reader RVar14;
  Reader RVar15;
  BuilderFor<capnp::schema::Node::SourceInfo> sourceInfo;
  undefined1 local_129 [9];
  undefined8 uStack_120;
  WirePointer *local_118;
  int local_110;
  StructReader local_108;
  StructBuilder local_d8;
  OrphanBuilder local_a8;
  OrphanBuilder local_88;
  StructBuilder local_68;
  char *local_40;
  long local_38;
  
  capnp::_::OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_108,(this->translator->orphanage).arena,
             (this->translator->orphanage).capTable,(StructSize)0x60006);
  local_a8.segment = (SegmentBuilder *)local_108.capTable;
  local_a8.capTable = (CapTableBuilder *)local_108.data;
  local_a8.location = (word *)CONCAT44(local_108.pointers._4_4_,(int)local_108.pointers);
  local_a8.tag.content = (uint64_t)local_108.segment;
  capnp::_::OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_108,(this->translator->orphanage).arena,
             (this->translator->orphanage).capTable,(StructSize)0x20002);
  local_88.segment = (SegmentBuilder *)local_108.capTable;
  local_88.capTable = (CapTableBuilder *)local_108.data;
  local_88.location = (word *)CONCAT44(local_108.pointers._4_4_,(int)local_108.pointers);
  local_88.tag.content = (uint64_t)local_108.segment;
  capnp::_::OrphanBuilder::asStruct(&local_d8,&local_a8,(StructSize)0x60006);
  capnp::_::OrphanBuilder::asStruct(&local_68,&local_88,(StructSize)0x20002);
  bVar9 = decl._reader.pointerCount == 0;
  local_118 = decl._reader.pointers;
  if (bVar9) {
    local_118 = (WirePointer *)0x0;
  }
  local_110 = 0x7fffffff;
  if (!bVar9) {
    local_110 = decl._reader.nestingLimit;
  }
  local_129._1_4_ = 0;
  local_129._5_4_ = 0;
  uVar10 = 0;
  uVar11 = 0;
  if (!bVar9) {
    local_129._1_4_ = decl._reader.segment._0_4_;
    local_129._5_4_ = decl._reader.segment._4_4_;
    uVar10 = decl._reader.capTable._0_4_;
    uVar11 = decl._reader.capTable._4_4_;
  }
  uStack_120 = (CapTableReader *)CONCAT44(uVar11,uVar10);
  capnp::_::PointerReader::getStruct(&local_108,(PointerReader *)((long)local_129 + 1),(word *)0x0);
  bVar9 = local_108.pointerCount == 0;
  local_118 = (WirePointer *)CONCAT44(local_108.pointers._4_4_,(int)local_108.pointers);
  if (bVar9) {
    local_118 = (WirePointer *)0x0;
  }
  local_110 = 0x7fffffff;
  if (!bVar9) {
    local_110 = local_108.nestingLimit;
  }
  local_129._1_4_ = 0;
  local_129._5_4_ = 0;
  uVar10 = 0;
  uVar11 = 0;
  if (!bVar9) {
    local_129._1_4_ = local_108.segment._0_4_;
    local_129._5_4_ = local_108.segment._4_4_;
    uVar10 = local_108.capTable._0_4_;
    uVar11 = local_108.capTable._4_4_;
  }
  uStack_120 = (CapTableReader *)CONCAT44(uVar11,uVar10);
  RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                     ((PointerReader *)((long)local_129 + 1),(void *)0x0,0);
  local_40 = RVar14.super_StringPtr.content.ptr;
  bVar9 = parent._reader.pointerCount == 0;
  local_108.data = parent._reader.pointers;
  if (bVar9) {
    local_108.data = (WirePointer *)0x0;
  }
  local_108.pointers._0_4_ = 0x7fffffff;
  if (!bVar9) {
    local_108.pointers._0_4_ = parent._reader.nestingLimit;
  }
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  uVar13 = 0;
  if (!bVar9) {
    uVar10 = parent._reader.segment._0_4_;
    uVar11 = parent._reader.segment._4_4_;
    uVar12 = parent._reader.capTable._0_4_;
    uVar13 = parent._reader.capTable._4_4_;
  }
  local_108.segment = (SegmentReader *)CONCAT44(uVar11,uVar10);
  local_108.capTable = (CapTableReader *)CONCAT44(uVar13,uVar12);
  RVar15 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_108,(void *)0x0,0);
  local_108.segment = RVar15.super_StringPtr.content.ptr;
  local_108.capTable = (CapTableReader *)(RVar15.super_StringPtr.content.size_ - 1);
  local_129[0] = 0x2e;
  local_38 = RVar14.super_StringPtr.content.size_ - 1;
  kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
            ((String *)((long)local_129 + 1),(_ *)&local_108,(ArrayPtr<const_char> *)local_129,
             (FixedArray<char,_1UL> *)&local_40,in_R8);
  pSVar8 = (SegmentReader *)local_129._1_8_;
  if (uStack_120 == (CapTableReader *)0x0) {
    pSVar8 = (SegmentReader *)0x1d857d;
  }
  RVar15.super_StringPtr.content.size_ =
       (long)&uStack_120->_vptr_CapTableReader + (ulong)(uStack_120 == (CapTableReader *)0x0);
  local_108.segment = &(local_d8.segment)->super_SegmentReader;
  local_108.capTable = &(local_d8.capTable)->super_CapTableReader;
  local_108.data = local_d8.pointers;
  RVar15.super_StringPtr.content.ptr = (char *)pSVar8;
  capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_108,RVar15);
  pCVar5 = uStack_120;
  uVar4 = local_129._1_8_;
  if ((SegmentReader *)local_129._1_8_ != (SegmentReader *)0x0) {
    local_129._1_8_ = (SegmentReader *)0x0;
    uStack_120 = (CapTableReader *)0x0;
    (**(code **)*local_118)(local_118,uVar4,1,pCVar5,pCVar5,0);
  }
  local_108.segment = &(local_d8.segment)->super_SegmentReader;
  local_108.capTable = &(local_d8.capTable)->super_CapTableReader;
  local_108.data = local_d8.pointers;
  capnp::_::PointerBuilder::getBlob<capnp::Text>
            ((Builder *)((long)local_129 + 1),(PointerBuilder *)&local_108,(void *)0x0,0);
  *(int *)((long)local_d8.data + 8) = (int)local_118 - (int)RVar14.super_StringPtr.content.size_;
  bVar7 = 0;
  if (0x120 < parent._reader.dataSize) {
    bVar7 = *(byte *)((long)parent._reader.data + 0x24) & 1;
  }
  *(byte *)((long)local_d8.data + 0x24) = *(byte *)((long)local_d8.data + 0x24) & 0xfe | bVar7;
  *(undefined4 *)((long)local_d8.data + 0xc) = 1;
  *(undefined4 *)((long)local_d8.data + 0x18) = 0;
  *(byte *)((long)local_d8.data + 0x1c) = *(byte *)((long)local_d8.data + 0x1c) & 0xfe;
  *(undefined2 *)((long)local_d8.data + 0x1e) = 0;
  *(undefined4 *)((long)local_d8.data + 0x20) = 0;
  local_108.data = local_d8.pointers + 3;
  local_108.segment = &(local_d8.segment)->super_SegmentReader;
  local_108.capTable = &(local_d8.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::clear((PointerBuilder *)&local_108);
  *(byte *)((long)local_d8.data + 0x1c) = *(byte *)((long)local_d8.data + 0x1c) | 1;
  if (decl._reader.dataSize < 0x40) {
    *(undefined8 *)((long)local_d8.data + 0x28) = 0;
    *(undefined4 *)((long)local_68.data + 8) = 0;
  }
  else {
    *(undefined4 *)((long)local_d8.data + 0x28) = *(undefined4 *)((long)decl._reader.data + 4);
    if (0x5f < decl._reader.dataSize) {
      *(undefined4 *)((long)local_d8.data + 0x2c) = *(undefined4 *)((long)decl._reader.data + 8);
      *(undefined4 *)((long)local_68.data + 8) = *(undefined4 *)((long)decl._reader.data + 4);
      uVar10 = *(undefined4 *)((long)decl._reader.data + 8);
      goto LAB_0013a2e8;
    }
    *(undefined4 *)((long)local_d8.data + 0x2c) = 0;
    *(undefined4 *)((long)local_68.data + 8) = *(undefined4 *)((long)decl._reader.data + 4);
  }
  uVar10 = 0;
LAB_0013a2e8:
  *(undefined4 *)((long)local_68.data + 0xc) = uVar10;
  pNVar2 = this->translator;
  pRVar6 = (pNVar2->groups).builder.pos;
  if (pRVar6 == (pNVar2->groups).builder.endPtr) {
    pRVar3 = (pNVar2->groups).builder.ptr;
    newSize = 4;
    if (pRVar6 != pRVar3) {
      newSize = (long)pRVar6 - (long)pRVar3 >> 5;
    }
    kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::setCapacity(&pNVar2->groups,newSize);
    pRVar6 = (pNVar2->groups).builder.pos;
  }
  (pRVar6->node).builder.segment = local_a8.segment;
  (pRVar6->node).builder.capTable = local_a8.capTable;
  (pRVar6->node).builder.location = local_a8.location;
  (pRVar6->node).builder.tag.content = local_a8.tag.content;
  (pRVar6->sourceInfo).builder.segment = local_88.segment;
  (pRVar6->sourceInfo).builder.capTable = local_88.capTable;
  (pRVar6->sourceInfo).builder.location = local_88.location;
  (pRVar6->sourceInfo).builder.tag.content = local_88.tag.content;
  ppRVar1 = &(pNVar2->groups).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  (__return_storage_ptr__->node)._builder.dataSize = local_d8.dataSize;
  (__return_storage_ptr__->node)._builder.pointerCount = local_d8.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->node)._builder.field_0x26 = local_d8._38_2_;
  (__return_storage_ptr__->node)._builder.data = local_d8.data;
  (__return_storage_ptr__->node)._builder.pointers = local_d8.pointers;
  (__return_storage_ptr__->node)._builder.segment = local_d8.segment;
  (__return_storage_ptr__->node)._builder.capTable = local_d8.capTable;
  (__return_storage_ptr__->sourceInfo)._builder.segment = local_68.segment;
  (__return_storage_ptr__->sourceInfo)._builder.capTable = local_68.capTable;
  (__return_storage_ptr__->sourceInfo)._builder.data = local_68.data;
  (__return_storage_ptr__->sourceInfo)._builder.pointers = local_68.pointers;
  (__return_storage_ptr__->sourceInfo)._builder.dataSize = local_68.dataSize;
  (__return_storage_ptr__->sourceInfo)._builder.pointerCount = local_68.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->sourceInfo)._builder.field_0x26 = local_68._38_2_;
  return __return_storage_ptr__;
}

Assistant:

NodeSourceInfoBuilderPair newGroupNode(schema::Node::Reader parent, Declaration::Reader decl) {
    AuxNode aux {
      translator.orphanage.newOrphan<schema::Node>(),
      translator.orphanage.newOrphan<schema::Node::SourceInfo>()
    };
    auto node = aux.node.get();
    auto sourceInfo = aux.sourceInfo.get();
    auto name = decl.getName().getValue();

    // We'll set the ID and scope ID later.
    node.setDisplayName(kj::str(parent.getDisplayName(), '.', name));
    node.setDisplayNamePrefixLength(node.getDisplayName().size() - name.size());
    node.setIsGeneric(parent.getIsGeneric());
    node.initStruct().setIsGroup(true);
    node.setStartByte(decl.getStartByte());
    node.setEndByte(decl.getEndByte());

    sourceInfo.setStartByte(decl.getStartByte());
    sourceInfo.setEndByte(decl.getEndByte());

    // The remaining contents of node.struct will be filled in later.

    translator.groups.add(kj::mv(aux));
    return { node, sourceInfo };
  }